

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

Var Js::JavascriptString::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags CVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  PropertyRecord *propertyRecord;
  JavascriptString *pJVar7;
  JavascriptLibrary *pJVar8;
  RecyclableObject *constructor;
  RecyclableObject *obj;
  JavascriptSymbol *local_b0;
  JavascriptSymbol *local_a8;
  JavascriptSymbol *symbol;
  Var result;
  JavascriptString *str;
  byte local_61;
  Var pvStack_60;
  bool isCtorSuperCall;
  Var newTarget;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x7d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  newTarget = RecyclableObject::GetScriptContext(function);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x80,"(args.Info.Count > 0)","Negative argument count");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pvStack_60 = Arguments::GetNewTarget((Arguments *)&scriptContext);
  Arguments::Arguments((Arguments *)&str,(Arguments *)&scriptContext);
  local_61 = Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&str);
  if (((uint)scriptContext & 0xffffff) == 1 || ((ulong)scriptContext & 0xffffff) == 0) {
    pJVar8 = ScriptContext::GetLibrary((ScriptContext *)newTarget);
    result = JavascriptLibrary::GetEmptyString(pJVar8);
  }
  else {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
    bVar2 = VarIs<Js::JavascriptSymbol>(pvVar6);
    if (bVar2) {
      local_a8 = UnsafeVarTo<Js::JavascriptSymbol>(pvVar6);
    }
    else {
      local_a8 = (JavascriptSymbol *)0x0;
    }
    if (local_a8 != (JavascriptSymbol *)0x0) {
      CVar3 = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                            (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                             CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                            CallFlags_New),CallFlags_New);
      bVar2 = operator!(CVar3);
      if (bVar2) {
        propertyRecord = JavascriptSymbol::GetValue(local_a8);
        pJVar7 = JavascriptSymbol::ToString(propertyRecord,(ScriptContext *)newTarget);
        return pJVar7;
      }
    }
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
    result = JavascriptConversion::ToString(pvVar6,(ScriptContext *)newTarget);
  }
  CVar3 = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                        (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                         CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                        CallFlags_New),CallFlags_New);
  if (CVar3 == CallFlags_None) {
    symbol = (JavascriptSymbol *)result;
  }
  else {
    pJVar8 = ScriptContext::GetLibrary((ScriptContext *)newTarget);
    symbol = (JavascriptSymbol *)
             JavascriptLibrary::CreateStringObject(pJVar8,(JavascriptString *)result);
  }
  if ((local_61 & 1) == 0) {
    local_b0 = symbol;
  }
  else {
    constructor = VarTo<Js::RecyclableObject>(pvStack_60);
    obj = UnsafeVarTo<Js::RecyclableObject>(symbol);
    local_b0 = (JavascriptSymbol *)
               Js::JavascriptOperators::OrdinaryCreateFromConstructor
                         (constructor,obj,(DynamicObject *)0x0,(ScriptContext *)newTarget);
  }
  return local_b0;
}

Assistant:

Var JavascriptString::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Negative argument count");

        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch.
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        JavascriptString* str;
        Var result;

        if (args.Info.Count > 1)
        {
            JavascriptSymbol * symbol = JavascriptOperators::TryFromVar<JavascriptSymbol>(args[1]);
            if (symbol && !(callInfo.Flags & CallFlags_New))
            {
                // By ES2015 21.1.1.1 step 2, calling the String constructor directly results in an explicit ToString, which does not throw.
                return JavascriptSymbol::ToString(symbol->GetValue(), scriptContext);
                // Calling with new is an implicit ToString on the Symbol, resulting in a throw. For this case we can let JavascriptConversion handle the call.
            }
            str = JavascriptConversion::ToString(args[1], scriptContext);
        }
        else
        {
            str = scriptContext->GetLibrary()->GetEmptyString();
        }

        if (callInfo.Flags & CallFlags_New)
        {
            result = scriptContext->GetLibrary()->CreateStringObject(str);
        }
        else
        {
            result = str;
        }

        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), UnsafeVarTo<RecyclableObject>(result), nullptr, scriptContext) :
            result;
    }